

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal-array.h
# Opt level: O3

void __thiscall
dynamicgraph::SignalArray<int>::SignalArray(SignalArray<int> *this,SignalBase<int> *sig)

{
  value_type *__val;
  pointer __s;
  allocator_type local_29;
  
  (this->super_SignalArray_const<int>)._vptr_SignalArray_const =
       (_func_int **)&PTR__SignalArray_const_00122828;
  std::
  vector<const_dynamicgraph::SignalBase<int>_*,_std::allocator<const_dynamicgraph::SignalBase<int>_*>_>
  ::vector(&(this->super_SignalArray_const<int>).const_array,0,&local_29);
  (this->super_SignalArray_const<int>).size = 0;
  (this->super_SignalArray_const<int>).rank = 0;
  (this->super_SignalArray_const<int>)._vptr_SignalArray_const =
       (_func_int **)&PTR__SignalArray_00122b70;
  (this->array).
  super__Vector_base<dynamicgraph::SignalBase<int>_*,_std::allocator<dynamicgraph::SignalBase<int>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->array).
  super__Vector_base<dynamicgraph::SignalBase<int>_*,_std::allocator<dynamicgraph::SignalBase<int>_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->array).
  super__Vector_base<dynamicgraph::SignalBase<int>_*,_std::allocator<dynamicgraph::SignalBase<int>_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __s = (pointer)operator_new(0xa0);
  (this->array).
  super__Vector_base<dynamicgraph::SignalBase<int>_*,_std::allocator<dynamicgraph::SignalBase<int>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = __s;
  (this->array).
  super__Vector_base<dynamicgraph::SignalBase<int>_*,_std::allocator<dynamicgraph::SignalBase<int>_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = __s + 0x14;
  memset(__s,0,0xa0);
  (this->array).
  super__Vector_base<dynamicgraph::SignalBase<int>_*,_std::allocator<dynamicgraph::SignalBase<int>_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = __s + 0x14;
  (this->super_SignalArray_const<int>).size = 0x14;
  addElmt(this,sig);
  return;
}

Assistant:

SignalArray<Time>(SignalBase<Time> &sig)
      : SignalArray_const<Time>(0), array(DEFAULT_SIZE) {
    size = DEFAULT_SIZE;
    addElmt(&sig);
  }